

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_struct_member
          (CompilerMSL *this,SPIRType *type,uint32_t member_type_id,uint32_t index,string *qualifier
          ,uint32_t param_5)

{
  bool bVar1;
  uint32_t uVar2;
  undefined1 local_58 [44];
  BuiltIn builtin;
  uint32_t pad_len;
  uint32_t param_5_local;
  string *qualifier_local;
  uint32_t index_local;
  uint32_t member_type_id_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  builtin = param_5;
  _pad_len = qualifier;
  qualifier_local._0_4_ = index;
  qualifier_local._4_4_ = member_type_id;
  _index_local = type;
  type_local = (SPIRType *)this;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  bVar1 = Compiler::has_extended_member_decoration
                    ((Compiler *)this,uVar2,(uint32_t)qualifier_local,
                     SPIRVCrossDecorationPaddingTarget);
  if (bVar1) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(_index_local->super_IVariant).self);
    local_58._40_4_ =
         Compiler::get_extended_member_decoration
                   ((Compiler *)this,uVar2,(uint32_t)qualifier_local,
                    SPIRVCrossDecorationPaddingTarget);
    CompilerGLSL::
    statement<char_const(&)[8],unsigned_int&,char_const(&)[5],char_const(&)[2],unsigned_int&,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [8])"char _m",(uint *)&qualifier_local,
               (char (*) [5])"_pad",(char (*) [2])0x40f992,(uint *)(local_58 + 0x28),
               (char (*) [3])0x40e4c1);
  }
  local_58._36_4_ = BuiltInMax;
  bVar1 = is_mesh_shader(this);
  if ((((!bVar1) ||
       (bVar1 = Compiler::is_member_builtin
                          ((Compiler *)this,_index_local,(uint32_t)qualifier_local,
                           (BuiltIn *)(local_58 + 0x24)), !bVar1)) ||
      (bVar1 = Compiler::has_active_builtin((Compiler *)this,local_58._36_4_,StorageClassOutput),
      bVar1)) ||
     (bVar1 = Compiler::has_active_builtin((Compiler *)this,local_58._36_4_,StorageClassInput),
     bVar1)) {
    this->builtin_declaration = true;
    to_struct_member((CompilerMSL *)local_58,(SPIRType *)this,(uint32_t)_index_local,
                     qualifier_local._4_4_,(string *)(ulong)(uint32_t)qualifier_local);
    CompilerGLSL::statement<std::__cxx11::string>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    ::std::__cxx11::string::~string((string *)local_58);
    this->builtin_declaration = false;
  }
  return;
}

Assistant:

void CompilerMSL::emit_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                     const string &qualifier, uint32_t)
{
	// If this member requires padding to maintain its declared offset, emit a dummy padding member before it.
	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationPaddingTarget))
	{
		uint32_t pad_len = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationPaddingTarget);
		statement("char _m", index, "_pad", "[", pad_len, "];");
	}

	BuiltIn builtin = BuiltInMax;
	if (is_mesh_shader() && is_member_builtin(type, index, &builtin))
	{
		if (!has_active_builtin(builtin, StorageClassOutput) && !has_active_builtin(builtin, StorageClassInput))
		{
			// Do not emit unused builtins in mesh-output blocks
			return;
		}
	}

	// Handle HLSL-style 0-based vertex/instance index.
	builtin_declaration = true;
	statement(to_struct_member(type, member_type_id, index, qualifier));
	builtin_declaration = false;
}